

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeGetNumRhsEvalsSens(void *cvode_mem,long *nfevalsS)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x864;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x8c) != 0) {
      *nfevalsS = *(long *)((long)cvode_mem + 0x648);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    error_code = -0x28;
    line = 0x86c;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetNumRhsEvalsSens",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeGetNumRhsEvalsSens(void* cvode_mem, long int* nfevalsS)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  *nfevalsS = cv_mem->cv_nfeS;

  return (CV_SUCCESS);
}